

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::AvgState<double>,double,duckdb::NumericAverageOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  double *pdVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  ulong uVar14;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_b0;
  long local_a8;
  long local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      lVar3 = *(long *)(input + 0x20);
      lVar4 = *(long *)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      lVar5 = *(long *)(input + 0x28);
      if (lVar5 == 0) {
        if (count == 0) {
          return;
        }
        iVar11 = 0;
        do {
          plVar2 = *(long **)(lVar4 + iVar11 * 8);
          *plVar2 = *plVar2 + 1;
          plVar2[1] = (long)(*(double *)(lVar3 + iVar11 * 8) + (double)plVar2[1]);
          iVar11 = iVar11 + 1;
        } while (count != iVar11);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar7 = 0;
      uVar9 = 0;
      do {
        uVar6 = *(ulong *)(lVar5 + uVar7 * 8);
        uVar8 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar8 = count;
        }
        uVar10 = uVar8;
        if (uVar6 != 0) {
          uVar10 = uVar9;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar9 < uVar8) {
              do {
                plVar2 = *(long **)(lVar4 + uVar9 * 8);
                *plVar2 = *plVar2 + 1;
                plVar2[1] = (long)(*(double *)(lVar3 + uVar9 * 8) + (double)plVar2[1]);
                uVar9 = uVar9 + 1;
                uVar10 = uVar8;
              } while (uVar8 != uVar9);
            }
          }
          else if (uVar9 < uVar8) {
            uVar14 = 0;
            do {
              if ((uVar6 >> (uVar14 & 0x3f) & 1) != 0) {
                plVar2 = *(long **)(lVar4 + uVar9 * 8 + uVar14 * 8);
                *plVar2 = *plVar2 + 1;
                plVar2[1] = (long)(*(double *)(lVar3 + uVar9 * 8 + uVar14 * 8) + (double)plVar2[1]);
              }
              uVar14 = uVar14 + 1;
              uVar10 = uVar8;
            } while (uVar8 - uVar9 != uVar14);
          }
        }
        uVar7 = uVar7 + 1;
        uVar9 = uVar10;
      } while (uVar7 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    pdVar1 = *(double **)(input + 0x20);
    plVar2 = (long *)**(undefined8 **)(states + 0x20);
    *plVar2 = *plVar2 + count;
    plVar2[1] = (long)((double)(long)count * *pdVar1 + (double)plVar2[1]);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_a0 == 0) {
    if (count != 0) {
      lVar3 = *local_b0;
      lVar4 = *local_68;
      iVar11 = 0;
      do {
        iVar12 = iVar11;
        if (lVar3 != 0) {
          iVar12 = (idx_t)*(uint *)(lVar3 + iVar11 * 4);
        }
        iVar13 = iVar11;
        if (lVar4 != 0) {
          iVar13 = (idx_t)*(uint *)(lVar4 + iVar11 * 4);
        }
        plVar2 = *(long **)(local_60 + iVar13 * 8);
        *plVar2 = *plVar2 + 1;
        plVar2[1] = (long)(*(double *)(local_a8 + iVar12 * 8) + (double)plVar2[1]);
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
  }
  else if (count != 0) {
    lVar3 = *local_b0;
    lVar4 = *local_68;
    iVar11 = 0;
    do {
      iVar12 = iVar11;
      if (lVar3 != 0) {
        iVar12 = (idx_t)*(uint *)(lVar3 + iVar11 * 4);
      }
      iVar13 = iVar11;
      if (lVar4 != 0) {
        iVar13 = (idx_t)*(uint *)(lVar4 + iVar11 * 4);
      }
      if ((*(ulong *)(local_a0 + (iVar12 >> 6) * 8) >> (iVar12 & 0x3f) & 1) != 0) {
        plVar2 = *(long **)(local_60 + iVar13 * 8);
        *plVar2 = *plVar2 + 1;
        plVar2[1] = (long)(*(double *)(local_a8 + iVar12 * 8) + (double)plVar2[1]);
      }
      iVar11 = iVar11 + 1;
    } while (count != iVar11);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}